

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_print(Context *context,IntrinsicResult partialResult)

{
  code *pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  Value *this;
  String SVar4;
  Value delimiter;
  Value s;
  Value local_88;
  Value local_78;
  String local_68;
  Value local_58;
  Value local_48;
  String local_38;
  String local_28;
  
  String::String(&local_28,"s");
  Context::GetVar((Context *)&s,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  String::~String(&local_28);
  if (s.type == Null) {
    Value::Value(&delimiter,"null");
    Value::operator=(&s,&delimiter);
    Value::~Value(&delimiter);
  }
  String::String(&local_38,"delimiter");
  Context::GetVar((Context *)&delimiter,(String *)partialResult.rs,(LocalOnlyMode)&local_38);
  String::~String(&local_38);
  if (delimiter.type == Null) {
    pp_Var2 = (partialResult.rs[2].result.data.ref)->_vptr_RefCountedStorage;
    SVar4 = Value::ToString(&local_48,(Machine *)&s);
    (*(code *)pp_Var2)(&local_48,0,SVar4._8_8_);
    this = &local_48;
  }
  else {
    bVar3 = Value::operator==(&delimiter,(Value *)_EOL);
    pcVar1 = *(code **)partialResult.rs[2].result.data;
    if (bVar3) {
      SVar4 = Value::ToString(&local_58,(Machine *)&s);
      (*pcVar1)(&local_58,1,SVar4._8_8_);
      this = &local_58;
    }
    else {
      Value::ToString(&local_78,(Machine *)&s);
      Value::ToString(&local_88,(Machine *)&delimiter);
      SVar4 = String::operator+(&local_68,(String *)&local_78);
      (*pcVar1)(&local_68,0,SVar4._8_8_);
      String::~String(&local_68);
      String::~String((String *)&local_88);
      this = &local_78;
    }
  }
  String::~String((String *)this);
  IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
  Value::~Value(&delimiter);
  Value::~Value(&s);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_print(Context *context, IntrinsicResult partialResult) {
		Value s = context->GetVar("s");
		if (s.IsNull()) s = "null";
		Value delimiter = context->GetVar("delimiter");
		if (delimiter.IsNull()) {
			(*context->vm->standardOutput)(s.ToString(), false);
		} else if (delimiter == _EOL) {
			(*context->vm->standardOutput)(s.ToString(), true);
		} else {
			(*context->vm->standardOutput)(s.ToString() + delimiter.ToString(), false);
		}
		return IntrinsicResult::Null;
	}